

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

bool r_exec::IPGMContext::Ins(IPGMContext *context,uint16_t *index)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  ushort index_00;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Atom *pAVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  Atom local_424 [4];
  Atom local_420 [4];
  Atom local_41c [4];
  Atom local_418 [4];
  Atom local_414 [6];
  uint16_t local_40e;
  Atom local_40c [4];
  Atom local_408 [2];
  uint16_t extent_index;
  Atom local_404 [4];
  ushort local_400;
  ushort local_3fe;
  Atom local_3fc [4];
  uint16_t input_count;
  uint16_t input_index;
  Code *ipgm;
  IPGMContext local_3e8;
  IPGMContext local_3b8;
  IPGMContext local_388;
  undefined1 local_358 [8];
  IPGMContext skel;
  undefined1 local_2f8 [8];
  IPGMContext arg;
  undefined1 local_2c0 [6];
  uint16_t i;
  IPGMContext pattern_set;
  uint16_t arg_count;
  uint16_t pattern_set_index;
  short local_27a;
  Code *pCStack_278;
  uint16_t pgm_opcode;
  Code *pgm;
  undefined1 local_240 [8];
  IPGMContext nfr;
  undefined1 local_1e0 [8];
  IPGMContext res;
  undefined1 local_180 [8];
  IPGMContext tsc;
  undefined1 local_120 [8];
  IPGMContext run;
  undefined1 local_c0 [8];
  IPGMContext args;
  IPGMContext local_80;
  undefined1 local_50 [8];
  IPGMContext object;
  uint16_t *index_local;
  IPGMContext *context_local;
  
  object.view = (View *)index;
  getChild(&local_80,context,1);
  operator*((IPGMContext *)local_50,&local_80);
  ~IPGMContext(&local_80);
  getChild((IPGMContext *)&run.view,context,2);
  operator*((IPGMContext *)local_c0,(IPGMContext *)&run.view);
  ~IPGMContext((IPGMContext *)&run.view);
  getChild((IPGMContext *)&tsc.view,context,3);
  operator*((IPGMContext *)local_120,(IPGMContext *)&tsc.view);
  ~IPGMContext((IPGMContext *)&tsc.view);
  getChild((IPGMContext *)&res.view,context,4);
  operator*((IPGMContext *)local_180,(IPGMContext *)&res.view);
  ~IPGMContext((IPGMContext *)&res.view);
  getChild((IPGMContext *)&nfr.view,context,5);
  operator*((IPGMContext *)local_1e0,(IPGMContext *)&nfr.view);
  ~IPGMContext((IPGMContext *)&nfr.view);
  getChild((IPGMContext *)&pgm,context,6);
  operator*((IPGMContext *)local_240,(IPGMContext *)&pgm);
  ~IPGMContext((IPGMContext *)&pgm);
  pCStack_278 = getObject((IPGMContext *)local_50);
  (*(pCStack_278->super__Object)._vptr__Object[4])();
  local_27a = r_code::Atom::asOpcode();
  if ((local_27a == Opcodes::Pgm) || (local_27a == Opcodes::AntiPgm)) {
    if (pCStack_278 != (Code *)0x0) {
      operator[]((IPGMContext *)local_c0,0);
      cVar1 = r_code::Atom::getDescriptor();
      if (cVar1 == -0x3f) {
        (*(pCStack_278->super__Object)._vptr__Object[4])();
        index_00 = r_code::Atom::asIndex();
        operator[]((IPGMContext *)local_c0,0);
        bVar2 = r_code::Atom::getAtomCount();
        (*(pCStack_278->super__Object)._vptr__Object[4])(pCStack_278,(ulong)index_00);
        bVar3 = r_code::Atom::getAtomCount();
        if ((ushort)bVar3 == (ushort)bVar2) {
          IPGMContext((IPGMContext *)local_2c0,pCStack_278,index_00);
          for (arg.view._6_2_ = 1; arg.view._6_2_ <= bVar2; arg.view._6_2_ = arg.view._6_2_ + 1) {
            getChild((IPGMContext *)&skel.view,(IPGMContext *)local_c0,arg.view._6_2_);
            operator*((IPGMContext *)local_2f8,(IPGMContext *)&skel.view);
            ~IPGMContext((IPGMContext *)&skel.view);
            getChild(&local_3e8,(IPGMContext *)local_2c0,arg.view._6_2_);
            operator*(&local_3b8,&local_3e8);
            getChild(&local_388,&local_3b8,1);
            operator*((IPGMContext *)local_358,&local_388);
            ~IPGMContext(&local_388);
            ~IPGMContext(&local_3b8);
            ~IPGMContext(&local_3e8);
            bVar4 = match((IPGMContext *)local_358,(IPGMContext *)local_2f8);
            if (!bVar4) {
              r_code::Atom::Nil();
              _Context::setAtomicResult(&context->super__Context,(Atom *)((long)&ipgm + 4));
              r_code::Atom::~Atom((Atom *)((long)&ipgm + 4));
              context_local._7_1_ = 0;
            }
            ~IPGMContext((IPGMContext *)local_358);
            ~IPGMContext((IPGMContext *)local_2f8);
            if (!bVar4) goto LAB_00214f1f;
          }
          if (local_27a == Opcodes::AntiPgm) {
            r_code::Atom::InstantiatedAntiProgram((ushort)local_3fc,(uchar)Opcodes::IPgm);
            _input_count = build_object(context,local_3fc);
            r_code::Atom::~Atom(local_3fc);
          }
          else {
            (*(pCStack_278->super__Object)._vptr__Object[4])(pCStack_278,2);
            local_3fe = r_code::Atom::asIndex();
            (*(pCStack_278->super__Object)._vptr__Object[4])(pCStack_278,(ulong)local_3fe);
            bVar2 = r_code::Atom::getAtomCount();
            local_400 = (ushort)bVar2;
            if (local_400 == 0) {
              r_code::Atom::InstantiatedInputLessProgram((ushort)local_404,(uchar)Opcodes::IPgm);
              _input_count = build_object(context,local_404);
              r_code::Atom::~Atom(local_404);
            }
            else {
              r_code::Atom::InstantiatedProgram((ushort)local_408,(uchar)Opcodes::IPgm);
              _input_count = build_object(context,local_408);
              r_code::Atom::~Atom(local_408);
            }
          }
          r_code::Atom::RPointer((ushort)local_40c);
          iVar5 = (*(_input_count->super__Object)._vptr__Object[4])(_input_count,1);
          r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar5),local_40c);
          r_code::Atom::~Atom(local_40c);
          (*(_input_count->super__Object)._vptr__Object[0x19])(_input_count,pCStack_278);
          local_40e = 0;
          r_code::Atom::IPointer((ushort)local_414);
          iVar5 = (*(_input_count->super__Object)._vptr__Object[4])(_input_count,2);
          r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_00,iVar5),local_414);
          r_code::Atom::~Atom(local_414);
          copy<r_code::Code>((IPGMContext *)local_c0,_input_count,8,&local_40e);
          pAVar6 = operator[]((IPGMContext *)local_120,0);
          iVar5 = (*(_input_count->super__Object)._vptr__Object[4])(_input_count,3);
          r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_01,iVar5),pAVar6);
          r_code::Atom::IPointer((ushort)local_418);
          iVar5 = (*(_input_count->super__Object)._vptr__Object[4])(_input_count,4);
          r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_02,iVar5),local_418);
          r_code::Atom::~Atom(local_418);
          pAVar6 = operator[]((IPGMContext *)local_180,0);
          local_40e = local_40e + 1;
          iVar5 = (*(_input_count->super__Object)._vptr__Object[4])();
          r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_03,iVar5),pAVar6);
          pAVar6 = operator[]((IPGMContext *)local_180,1);
          local_40e = local_40e + 1;
          iVar5 = (*(_input_count->super__Object)._vptr__Object[4])();
          r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_04,iVar5),pAVar6);
          pAVar6 = operator[]((IPGMContext *)local_180,2);
          local_40e = local_40e + 1;
          iVar5 = (*(_input_count->super__Object)._vptr__Object[4])();
          r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_05,iVar5),pAVar6);
          pAVar6 = operator[]((IPGMContext *)local_1e0,0);
          iVar5 = (*(_input_count->super__Object)._vptr__Object[4])(_input_count,5);
          r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_06,iVar5),pAVar6);
          pAVar6 = operator[]((IPGMContext *)local_240,0);
          iVar5 = (*(_input_count->super__Object)._vptr__Object[4])(_input_count,6);
          r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_07,iVar5),pAVar6);
          r_code::Atom::Float(1.0);
          iVar5 = (*(_input_count->super__Object)._vptr__Object[4])(_input_count,7);
          r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_08,iVar5),local_41c);
          r_code::Atom::~Atom(local_41c);
          addProduction(context,_input_count,true);
          r_code::Atom::ProductionPointer((ushort)local_420);
          _Context::setAtomicResult(&context->super__Context,local_420);
          r_code::Atom::~Atom(local_420);
          context_local._7_1_ = 1;
LAB_00214f1f:
          ~IPGMContext((IPGMContext *)local_2c0);
        }
        else {
          r_code::Atom::Nil();
          _Context::setAtomicResult(&context->super__Context,(Atom *)((long)&pattern_set.view + 4));
          r_code::Atom::~Atom((Atom *)((long)&pattern_set.view + 4));
          context_local._7_1_ = 0;
        }
        goto LAB_00214fa5;
      }
    }
    r_code::Atom::Nil();
    _Context::setAtomicResult(&context->super__Context,local_424);
    r_code::Atom::~Atom(local_424);
    context_local._7_1_ = 0;
  }
  else {
    r_code::Atom::Nil();
    _Context::setAtomicResult(&context->super__Context,(Atom *)&arg_count);
    r_code::Atom::~Atom((Atom *)&arg_count);
    context_local._7_1_ = 0;
  }
LAB_00214fa5:
  ~IPGMContext((IPGMContext *)local_240);
  ~IPGMContext((IPGMContext *)local_1e0);
  ~IPGMContext((IPGMContext *)local_180);
  ~IPGMContext((IPGMContext *)local_120);
  ~IPGMContext((IPGMContext *)local_c0);
  ~IPGMContext((IPGMContext *)local_50);
  return (bool)(context_local._7_1_ & 1);
}

Assistant:

bool IPGMContext::Ins(const IPGMContext &context, uint16_t &index)
{
    IPGMContext object = *context.getChild(1);
    IPGMContext args = *context.getChild(2);
    IPGMContext run = *context.getChild(3);
    IPGMContext tsc = *context.getChild(4);
    IPGMContext res = *context.getChild(5);
    IPGMContext nfr = *context.getChild(6);
    Code *pgm = object.getObject();
    uint16_t pgm_opcode = pgm->code(0).asOpcode();

    if (pgm_opcode != Opcodes::Pgm &&
        pgm_opcode != Opcodes::AntiPgm) {
        context.setAtomicResult(Atom::Nil());
        return false;
    }

    if (pgm && args[0].getDescriptor() == Atom::SET) {
        uint16_t pattern_set_index = pgm->code(PGM_TPL_ARGS).asIndex();
        uint16_t arg_count = args[0].getAtomCount();

        if (pgm->code(pattern_set_index).getAtomCount() != arg_count) {
            context.setAtomicResult(Atom::Nil());
            return false;
        }

        // match args with the tpl patterns in _object.
        IPGMContext pattern_set(pgm, pattern_set_index);

        for (uint16_t i = 1; i <= arg_count; ++i) {
            IPGMContext arg = *args.getChild(i);
            IPGMContext skel = *(*pattern_set.getChild(i)).getChild(1);

            if (!skel.match(arg)) {
                context.setAtomicResult(Atom::Nil());
                return false;
            }
        }

        Code *ipgm; // created in the production array.

        if (pgm_opcode == Opcodes::AntiPgm) {
            ipgm = context.build_object(Atom::InstantiatedAntiProgram(Opcodes::IPgm, IPGM_ARITY));
        } else {
            uint16_t input_index = pgm->code(PGM_INPUTS).asIndex();
            uint16_t input_count = pgm->code(input_index).getAtomCount();

            if (input_count == 0) {
                ipgm = context.build_object(Atom::InstantiatedInputLessProgram(Opcodes::IPgm, IPGM_ARITY));
            } else {
                ipgm = context.build_object(Atom::InstantiatedProgram(Opcodes::IPgm, IPGM_ARITY));
            }
        }

        ipgm->code(IPGM_PGM) = Atom::RPointer(0); // points to the pgm object.
        ipgm->add_reference(pgm);
        uint16_t extent_index = 0;
        ipgm->code(IPGM_ARGS) = Atom::IPointer(IPGM_ARITY + 1); // points to the arg set.
        args.copy(ipgm, IPGM_ARITY + 1, extent_index); // writes the args after psln_thr.
        ipgm->code(IPGM_RUN) = run[0];
        ipgm->code(IPGM_TSC) = Atom::IPointer(extent_index); // points to the tsc.
        ipgm->code(extent_index++) = tsc[0]; // writes the tsc after the args.
        ipgm->code(extent_index++) = tsc[1];
        ipgm->code(extent_index++) = tsc[2];
        ipgm->code(IPGM_RES) = res[0]; // res.
        ipgm->code(IPGM_NFR) = nfr[0]; // nfr.
        ipgm->code(IPGM_ARITY) = Atom::Float(1); // psln_thr.
        context.setAtomicResult(Atom::ProductionPointer(context.addProduction(ipgm, true))); // object may be new: we don't know at this point, therefore check=true.
        return true;
    }

    context.setAtomicResult(Atom::Nil());
    return false;
}